

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall
NetOptimize::replace_convolution_with_innerproduct_after_global_pooling(NetOptimize *this)

{
  pointer *ppMVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar4;
  Layer *pLVar5;
  int *piVar6;
  void *pvVar7;
  long *plVar8;
  pointer pMVar9;
  pointer pMVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  pointer piVar14;
  size_type sVar15;
  int iVar16;
  int iVar17;
  Layer *pLVar18;
  long lVar19;
  ulong uVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  ulong uVar22;
  ParamDict pd;
  ParamDict local_40;
  
  pvVar4 = (this->super_ModelWriter).layers;
  lVar19 = (long)(pvVar4->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar4->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar19 != 0) {
    uVar20 = lVar19 >> 3;
    lVar19 = 0;
    do {
      iVar16 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar19]->type);
      if ((iVar16 == 0) &&
         (pLVar18 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar19],
         *(int *)((long)&pLVar18[1].userdata + 4) != 0)) {
        uVar22 = lVar19 + 1;
        if (uVar22 < uVar20) {
          iVar16 = *(pLVar18->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            iVar17 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar22]->type);
            if (((iVar17 == 0) &&
                (pLVar5 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar22],
                piVar6 = (pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar6 == 4)) && (*piVar6 == iVar16)
               ) goto LAB_0014bc8a;
            uVar22 = uVar22 + 1;
          } while (uVar22 < uVar20);
        }
        else {
LAB_0014bc8a:
          if (uVar22 != uVar20) {
            pLVar5 = (((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar22];
            fprintf(_stderr,"replace_convolution_with_innerproduct_after_global_pooling %s %s\n",
                    (pLVar18->name)._M_dataplus._M_p,(pLVar5->name)._M_dataplus._M_p);
            pLVar18 = ncnn::create_layer("InnerProduct");
            std::__cxx11::string::_M_replace
                      ((ulong)&pLVar18->type,0,(char *)(pLVar18->type)._M_string_length,0x31f4b7);
            std::__cxx11::string::_M_assign((string *)&pLVar18->name);
            std::vector<int,_std::allocator<int>_>::operator=(&pLVar18->bottoms,&pLVar5->bottoms);
            std::vector<int,_std::allocator<int>_>::operator=(&pLVar18->tops,&pLVar5->tops);
            ncnn::ParamDict::ParamDict(&local_40);
            (*pLVar18->_vptr_Layer[2])(pLVar18,&local_40);
            *(undefined4 *)&pLVar18[1]._vptr_Layer = *(undefined4 *)&pLVar5[1]._vptr_Layer;
            *(pointer *)((long)&pLVar18[1]._vptr_Layer + 4) = pLVar5[1].type._M_dataplus._M_p;
            uVar3 = (undefined4)pLVar5[1].type._M_string_length;
            pLVar18[1].support_bf16_storage = (bool)(char)uVar3;
            pLVar18[1].support_fp16_storage = (bool)(char)((uint)uVar3 >> 8);
            pLVar18[1].support_int8_storage = (bool)(char)((uint)uVar3 >> 0x10);
            pLVar18[1].support_image_storage = (bool)(char)((uint)uVar3 >> 0x18);
            paVar21 = &pLVar18[1].name.field_2;
            if (paVar21 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&pLVar5[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
              piVar6 = pLVar5[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = *(int **)((long)&pLVar18[1].name.field_2 + 8);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  pvVar7 = (void *)pLVar18[1].name.field_2._M_allocated_capacity;
                  plVar8 = (long *)pLVar18[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage;
                  if (plVar8 == (long *)0x0) {
                    if (pvVar7 != (void *)0x0) {
                      free(pvVar7);
                    }
                  }
                  else {
                    (**(code **)(*plVar8 + 0x18))();
                  }
                }
              }
              pLVar18[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              *(undefined8 *)((long)&pLVar18[1].name.field_2 + 0xc) = 0;
              *(undefined8 *)
               ((long)&pLVar18[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) = 0;
              paVar21->_M_allocated_capacity = 0;
              *(undefined8 *)((long)&pLVar18[1].name.field_2 + 8) = 0;
              pLVar18[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              pLVar18[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              *(undefined4 *)
               &pLVar18[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = 0;
              piVar14 = pLVar5[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              pLVar18[1].name.field_2._M_allocated_capacity =
                   (size_type)
                   pLVar5[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              *(pointer *)((long)&pLVar18[1].name.field_2 + 8) = piVar14;
              pLVar18[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   *(pointer *)
                    &pLVar5[1].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data;
              *(undefined4 *)
               &pLVar18[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                   *(undefined4 *)
                    &pLVar5[1].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_finish;
              pLVar18[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)pLVar5[1].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage;
              uVar3 = *(undefined4 *)
                       ((long)&pLVar5[1].top_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start + 4);
              uVar12 = *(undefined4 *)
                        &pLVar5[1].top_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              uVar13 = *(undefined4 *)
                        ((long)&pLVar5[1].top_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish + 4);
              *(undefined4 *)
               &pLVar18[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start =
                   *(undefined4 *)
                    &pLVar5[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data;
              *(undefined4 *)
               ((long)&pLVar18[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) = uVar3;
              *(undefined4 *)
               &pLVar18[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = uVar12;
              *(undefined4 *)
               ((long)&pLVar18[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4) = uVar13;
              *(undefined4 *)
               &pLVar18[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                   *(undefined4 *)
                    &pLVar5[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
              pLVar18[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)pLVar5[2]._vptr_Layer;
            }
            ppMVar1 = &pLVar18[1].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            if (ppMVar1 != (pointer *)&pLVar5[2].one_blob_only) {
              piVar6 = *(int **)&pLVar5[2].support_tensor_storage;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              pMVar9 = pLVar18[1].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              if (pMVar9 != (pointer)0x0) {
                LOCK();
                *(int *)&pMVar9->data = *(int *)&pMVar9->data + -1;
                UNLOCK();
                if (*(int *)&pMVar9->data == 0) {
                  pMVar9 = pLVar18[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                  pMVar10 = pLVar18[1].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage;
                  if (pMVar10 == (pointer)0x0) {
                    if (pMVar9 != (pointer)0x0) {
                      free(pMVar9);
                    }
                  }
                  else {
                    (**(code **)((long)pMVar10->data + 0x18))();
                  }
                }
              }
              pLVar18[2].support_reserved_6 = false;
              pLVar18[2].support_reserved_7 = false;
              pLVar18[2].support_reserved_8 = false;
              pLVar18[2].support_reserved_9 = false;
              pLVar18[2].support_reserved_10 = false;
              pLVar18[2].support_reserved_11 = false;
              pLVar18[2].support_reserved_12 = false;
              pLVar18[2].support_reserved_13 = false;
              *(undefined8 *)
               ((long)&pLVar18[1].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4) = 0;
              *(undefined8 *)
               ((long)&pLVar18[1].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) = 0;
              *ppMVar1 = (pointer)0x0;
              pLVar18[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pLVar18[2]._vptr_Layer = (_func_int **)0x0;
              pLVar18[2].one_blob_only = false;
              pLVar18[2].support_inplace = false;
              pLVar18[2].support_vulkan = false;
              pLVar18[2].support_packing = false;
              pLVar18[2].support_bf16_storage = false;
              pLVar18[2].support_fp16_storage = false;
              pLVar18[2].support_int8_storage = false;
              pLVar18[2].support_image_storage = false;
              pLVar18[2].support_tensor_storage = false;
              pLVar18[2].support_weight_fp16_storage = false;
              pLVar18[2].support_reserved_0 = false;
              pLVar18[2].support_reserved_1 = false;
              pMVar9 = *(pointer *)&pLVar5[2].support_tensor_storage;
              pLVar18[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = *(pointer *)&pLVar5[2].one_blob_only;
              pLVar18[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = pMVar9;
              pLVar18[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start = *(pointer *)&pLVar5[2].support_reserved_6;
              *(undefined4 *)
               &pLVar18[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish = *(undefined4 *)&pLVar5[2].userdata;
              pLVar18[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)&pLVar5[2].typeindex;
              uVar3 = *(undefined4 *)((long)&pLVar5[2].type._M_dataplus._M_p + 4);
              uVar12 = (undefined4)pLVar5[2].type._M_string_length;
              uVar13 = *(undefined4 *)((long)&pLVar5[2].type._M_string_length + 4);
              *(undefined4 *)&pLVar18[2]._vptr_Layer =
                   *(undefined4 *)&pLVar5[2].type._M_dataplus._M_p;
              *(undefined4 *)((long)&pLVar18[2]._vptr_Layer + 4) = uVar3;
              pLVar18[2].one_blob_only = (bool)(char)uVar12;
              pLVar18[2].support_inplace = (bool)(char)((uint)uVar12 >> 8);
              pLVar18[2].support_vulkan = (bool)(char)((uint)uVar12 >> 0x10);
              pLVar18[2].support_packing = (bool)(char)((uint)uVar12 >> 0x18);
              pLVar18[2].support_bf16_storage = (bool)(char)uVar13;
              pLVar18[2].support_fp16_storage = (bool)(char)((uint)uVar13 >> 8);
              pLVar18[2].support_int8_storage = (bool)(char)((uint)uVar13 >> 0x10);
              pLVar18[2].support_image_storage = (bool)(char)((uint)uVar13 >> 0x18);
              uVar3 = *(undefined4 *)&pLVar5[2].type.field_2;
              pLVar18[2].support_tensor_storage = (bool)(char)uVar3;
              pLVar18[2].support_weight_fp16_storage = (bool)(char)((uint)uVar3 >> 8);
              pLVar18[2].support_reserved_0 = (bool)(char)((uint)uVar3 >> 0x10);
              pLVar18[2].support_reserved_1 = (bool)(char)((uint)uVar3 >> 0x18);
              uVar11 = *(undefined8 *)((long)&pLVar5[2].type.field_2 + 8);
              pLVar18[2].support_reserved_6 = (bool)(char)uVar11;
              pLVar18[2].support_reserved_7 = (bool)(char)((ulong)uVar11 >> 8);
              pLVar18[2].support_reserved_8 = (bool)(char)((ulong)uVar11 >> 0x10);
              pLVar18[2].support_reserved_9 = (bool)(char)((ulong)uVar11 >> 0x18);
              pLVar18[2].support_reserved_10 = (bool)(char)((ulong)uVar11 >> 0x20);
              pLVar18[2].support_reserved_11 = (bool)(char)((ulong)uVar11 >> 0x28);
              pLVar18[2].support_reserved_12 = (bool)(char)((ulong)uVar11 >> 0x30);
              pLVar18[2].support_reserved_13 = (bool)(char)((ulong)uVar11 >> 0x38);
            }
            if ((string *)&pLVar18[2].userdata != &pLVar5[2].name) {
              piVar6 = (int *)pLVar5[2].name._M_string_length;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = *(int **)&pLVar18[2].typeindex;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  plVar8 = (long *)pLVar18[2].type.field_2._M_allocated_capacity;
                  if (plVar8 == (long *)0x0) {
                    if (pLVar18[2].userdata != (void *)0x0) {
                      free(pLVar18[2].userdata);
                    }
                  }
                  else {
                    (**(code **)(*plVar8 + 0x18))();
                  }
                }
              }
              pLVar18[2].name.field_2._M_allocated_capacity = 0;
              *(undefined8 *)&pLVar18[2].field_0x2c = 0;
              *(undefined8 *)((long)&pLVar18[2].type._M_dataplus._M_p + 4) = 0;
              pLVar18[2].userdata = (void *)0x0;
              *(undefined8 *)&pLVar18[2].typeindex = 0;
              *(undefined8 *)((long)&pLVar18[2].type.field_2 + 8) = 0;
              pLVar18[2].name._M_dataplus._M_p = (pointer)0x0;
              *(undefined4 *)&pLVar18[2].name._M_string_length = 0;
              sVar15 = pLVar5[2].name._M_string_length;
              pLVar18[2].userdata = pLVar5[2].name._M_dataplus._M_p;
              *(size_type *)&pLVar18[2].typeindex = sVar15;
              pLVar18[2].type._M_dataplus._M_p =
                   (pointer)pLVar5[2].name.field_2._M_allocated_capacity;
              *(undefined4 *)&pLVar18[2].type._M_string_length =
                   *(undefined4 *)((long)&pLVar5[2].name.field_2 + 8);
              pLVar18[2].type.field_2._M_allocated_capacity =
                   *(size_type *)
                    &pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data;
              uVar3 = *(undefined4 *)
                       ((long)&pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 4);
              uVar12 = *(undefined4 *)
                        &pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
              uVar13 = *(undefined4 *)
                        ((long)&pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
              *(undefined4 *)((long)&pLVar18[2].type.field_2 + 8) =
                   *(undefined4 *)
                    &pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
              *(undefined4 *)((long)&pLVar18[2].type.field_2 + 0xc) = uVar3;
              *(undefined4 *)&pLVar18[2].name._M_dataplus._M_p = uVar12;
              *(undefined4 *)((long)&pLVar18[2].name._M_dataplus._M_p + 4) = uVar13;
              *(undefined4 *)&pLVar18[2].name._M_string_length =
                   *(undefined4 *)
                    &pLVar5[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data;
              pLVar18[2].name.field_2._M_allocated_capacity =
                   (size_type)
                   pLVar5[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
            }
            puVar2 = (undefined8 *)((long)&pLVar18[2].name.field_2 + 8);
            if ((pointer *)puVar2 !=
                &pLVar5[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
              piVar6 = *(int **)&pLVar5[2].bottom_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = pLVar18[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  pvVar7 = *(void **)((long)&pLVar18[2].name.field_2 + 8);
                  plVar8 = (long *)pLVar18[2].tops.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                  if (plVar8 == (long *)0x0) {
                    if (pvVar7 != (void *)0x0) {
                      free(pvVar7);
                    }
                  }
                  else {
                    (**(code **)(*plVar8 + 0x18))();
                  }
                }
              }
              pLVar18[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              *(undefined8 *)
               ((long)&pLVar18[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) = 0;
              *(undefined8 *)
               ((long)&pLVar18[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4) = 0;
              *puVar2 = 0;
              pLVar18[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              pLVar18[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              pLVar18[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              *(undefined4 *)
               &pLVar18[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start = 0;
              piVar14 = *(pointer *)
                         &pLVar5[2].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data;
              *(pointer *)((long)&pLVar18[2].name.field_2 + 8) =
                   pLVar5[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              pLVar18[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = piVar14;
              pLVar18[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)pLVar5[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish;
              *(undefined4 *)
               &pLVar18[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                   *(undefined4 *)
                    &pLVar5[2].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
              pLVar18[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   *(pointer *)
                    &pLVar5[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data;
              uVar3 = *(undefined4 *)
                       ((long)&pLVar5[2].top_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish + 4);
              uVar12 = *(undefined4 *)
                        &pLVar5[2].top_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
              uVar13 = *(undefined4 *)
                        ((long)&pLVar5[2].top_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4);
              *(undefined4 *)
               &pLVar18[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                   *(undefined4 *)
                    &pLVar5[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
              *(undefined4 *)
               ((long)&pLVar18[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4) = uVar3;
              *(undefined4 *)
               &pLVar18[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = uVar12;
              *(undefined4 *)
               ((long)&pLVar18[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4) = uVar13;
              *(undefined4 *)
               &pLVar18[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start = *(undefined4 *)&pLVar5[3]._vptr_Layer;
              pLVar18[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = *(pointer *)&pLVar5[3].one_blob_only;
            }
            uVar3 = *(undefined4 *)((long)&pLVar5[1].type._M_string_length + 4);
            pLVar18[1].support_tensor_storage = (bool)(char)uVar3;
            pLVar18[1].support_weight_fp16_storage = (bool)(char)((uint)uVar3 >> 8);
            pLVar18[1].support_reserved_0 = (bool)(char)((uint)uVar3 >> 0x10);
            pLVar18[1].support_reserved_1 = (bool)(char)((uint)uVar3 >> 0x18);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&pLVar18[1].support_reserved_6 != &pLVar5[1].type.field_2) {
              piVar6 = *(int **)((long)&pLVar5[1].type.field_2 + 8);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = (int *)pLVar18[1].userdata;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  plVar8 = (long *)pLVar18[1].type._M_string_length;
                  if (plVar8 == (long *)0x0) {
                    if (*(void **)&pLVar18[1].support_reserved_6 != (void *)0x0) {
                      free(*(void **)&pLVar18[1].support_reserved_6);
                    }
                  }
                  else {
                    (**(code **)(*plVar8 + 0x18))();
                  }
                }
              }
              pLVar18[1].name._M_string_length = 0;
              *(undefined8 *)((long)&pLVar18[1].userdata + 4) = 0;
              *(undefined8 *)&pLVar18[1].field_0x2c = 0;
              pLVar18[1].support_reserved_6 = false;
              pLVar18[1].support_reserved_7 = false;
              pLVar18[1].support_reserved_8 = false;
              pLVar18[1].support_reserved_9 = false;
              pLVar18[1].support_reserved_10 = false;
              pLVar18[1].support_reserved_11 = false;
              pLVar18[1].support_reserved_12 = false;
              pLVar18[1].support_reserved_13 = false;
              pLVar18[1].userdata = (void *)0x0;
              pLVar18[1].type.field_2._M_allocated_capacity = 0;
              *(undefined8 *)((long)&pLVar18[1].type.field_2 + 8) = 0;
              *(undefined4 *)&pLVar18[1].name._M_dataplus._M_p = 0;
              sVar15 = pLVar5[1].type.field_2._M_allocated_capacity;
              pvVar7 = *(void **)((long)&pLVar5[1].type.field_2 + 8);
              pLVar18[1].support_reserved_6 = (bool)(char)sVar15;
              pLVar18[1].support_reserved_7 = (bool)(char)(sVar15 >> 8);
              pLVar18[1].support_reserved_8 = (bool)(char)(sVar15 >> 0x10);
              pLVar18[1].support_reserved_9 = (bool)(char)(sVar15 >> 0x18);
              pLVar18[1].support_reserved_10 = (bool)(char)(sVar15 >> 0x20);
              pLVar18[1].support_reserved_11 = (bool)(char)(sVar15 >> 0x28);
              pLVar18[1].support_reserved_12 = (bool)(char)(sVar15 >> 0x30);
              pLVar18[1].support_reserved_13 = (bool)(char)(sVar15 >> 0x38);
              pLVar18[1].userdata = pvVar7;
              *(pointer *)&pLVar18[1].typeindex = pLVar5[1].name._M_dataplus._M_p;
              *(int *)&pLVar18[1].type._M_dataplus._M_p = (int)pLVar5[1].name._M_string_length;
              pLVar18[1].type._M_string_length = pLVar5[1].name.field_2._M_allocated_capacity;
              uVar3 = *(undefined4 *)((long)&pLVar5[1].name.field_2 + 0xc);
              uVar12 = *(undefined4 *)
                        &pLVar5[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data;
              uVar13 = *(undefined4 *)
                        ((long)&pLVar5[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4);
              *(undefined4 *)&pLVar18[1].type.field_2 =
                   *(undefined4 *)((long)&pLVar5[1].name.field_2 + 8);
              *(undefined4 *)((long)&pLVar18[1].type.field_2 + 4) = uVar3;
              *(undefined4 *)((long)&pLVar18[1].type.field_2 + 8) = uVar12;
              *(undefined4 *)((long)&pLVar18[1].type.field_2 + 0xc) = uVar13;
              *(undefined4 *)&pLVar18[1].name._M_dataplus._M_p =
                   *(undefined4 *)
                    &pLVar5[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
              pLVar18[1].name._M_string_length =
                   (size_type)
                   pLVar5[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
            }
            (((this->super_ModelWriter).layers)->
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar22] = pLVar18;
            (*pLVar5->_vptr_Layer[1])(pLVar5);
            ncnn::ParamDict::~ParamDict(&local_40);
          }
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != uVar20 + (uVar20 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::replace_convolution_with_innerproduct_after_global_pooling()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Convolution
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Convolution")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[j];

        fprintf(stderr, "replace_convolution_with_innerproduct_after_global_pooling %s %s\n", pooling->name.c_str(), convolution->name.c_str());

        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)ncnn::create_layer("InnerProduct");

        innerproduct->type = "InnerProduct";
        innerproduct->name = convolution->name;
        innerproduct->bottoms = convolution->bottoms;
        innerproduct->tops = convolution->tops;

        ncnn::ParamDict pd;
        innerproduct->load_param(pd);

        innerproduct->num_output = convolution->num_output;
        innerproduct->bias_term = convolution->bias_term;
        innerproduct->weight_data_size = convolution->weight_data_size;
        innerproduct->int8_scale_term = convolution->int8_scale_term;

        innerproduct->weight_data = convolution->weight_data;
        innerproduct->bias_data = convolution->bias_data;
#if NCNN_INT8
        innerproduct->weight_data_int8_scales = convolution->weight_data_int8_scales;
        innerproduct->bottom_blob_int8_scales = convolution->bottom_blob_int8_scales;
#endif

        innerproduct->activation_type = convolution->activation_type;
        innerproduct->activation_params = convolution->activation_params;

        layers[j] = innerproduct;
        delete convolution;
    }

    return 0;
}